

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

void __thiscall ncnn::NetPrivate::update_input_output_names(NetPrivate *this)

{
  size_type sVar1;
  reference pvVar2;
  vector<const_char_*,_std::allocator<const_char_*>_> *this_00;
  long in_RDI;
  int blob_index_1;
  size_t i_1;
  int blob_index;
  size_t i;
  value_type *in_stack_ffffffffffffff98;
  vector<const_char_*,_std::allocator<const_char_*>_> *in_stack_ffffffffffffffa0;
  undefined8 local_28;
  undefined8 local_10;
  
  std::vector<const_char_*,_std::allocator<const_char_*>_>::clear
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)0x15887c);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::clear
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)0x15888d);
  local_10 = 0;
  while( true ) {
    sVar1 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x38));
    if (sVar1 <= local_10) break;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x38),local_10);
    std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
              ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)(in_RDI + 8),(long)*pvVar2);
    std::__cxx11::string::c_str();
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    local_10 = local_10 + 1;
  }
  local_28 = 0;
  while( true ) {
    sVar1 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x50));
    if (sVar1 <= local_28) break;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x50),local_28);
    this_00 = (vector<const_char_*,_std::allocator<const_char_*>_> *)(in_RDI + 0x80);
    std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
              ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)(in_RDI + 8),(long)*pvVar2);
    std::__cxx11::string::c_str();
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              (this_00,in_stack_ffffffffffffff98);
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

void NetPrivate::update_input_output_names()
{
    input_blob_names.clear();
    output_blob_names.clear();

    for (size_t i = 0; i < input_blob_indexes.size(); i++)
    {
        int blob_index = input_blob_indexes[i];
        input_blob_names.push_back(blobs[blob_index].name.c_str());
    }

    for (size_t i = 0; i < output_blob_indexes.size(); i++)
    {
        int blob_index = output_blob_indexes[i];
        output_blob_names.push_back(blobs[blob_index].name.c_str());
    }
}